

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O1

LY_ERR lys_compile_node_deviations_refines
                 (lysc_ctx *ctx,lysp_node *pnode,lysc_node *parent,lysp_node **dev_pnode,
                 ly_bool *not_supported)

{
  lysp_ext_instance **pplVar1;
  lysp_ext_instance **pplVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  lyd_node *plVar6;
  lyd_node *plVar7;
  undefined8 *puVar8;
  lysp_module *plVar9;
  lysp_node *plVar10;
  lys_module *plVar11;
  lysp_module *plVar12;
  long lVar13;
  lysp_restr *plVar14;
  ly_bool lVar15;
  uint16_t uVar16;
  LY_ERR LVar17;
  LY_ERR LVar18;
  ly_stmt lVar19;
  int iVar20;
  uint uVar21;
  lysp_ext_instance *plVar22;
  ulong uVar23;
  undefined8 *puVar24;
  char *pcVar25;
  long *plVar26;
  void *pvVar27;
  lysp_restr **pplVar28;
  lysp_node *plVar29;
  lysc_node *plVar30;
  void *pvVar31;
  char *pcVar32;
  long lVar33;
  lysp_node **pplVar34;
  lysp_ext_instance *plVar35;
  char *format;
  uint16_t *puVar36;
  uint *puVar37;
  LY_VECODE LVar38;
  lysp_qname *plVar39;
  size_t sVar40;
  ulong uVar41;
  ly_ctx *plVar42;
  char *pcVar43;
  char *pcVar44;
  char *pcVar45;
  uint64_t c__;
  lysp_ext_instance *plVar46;
  lysp_node *plVar47;
  ulong uVar48;
  bool bVar49;
  char local_1028 [4088];
  
  *dev_pnode = (lysp_node *)0x0;
  *not_supported = '\0';
  if ((ctx->uses_rfns).count != 0) {
    uVar41 = 0;
    do {
      while( true ) {
        plVar6 = (ctx->uses_rfns).field_2.dnodes[uVar41];
        plVar30 = (lysc_node *)plVar6->parent;
        lVar15 = lysp_schema_nodeid_match
                           (*(lysc_nodeid **)plVar6,(lysp_module *)plVar6->schema,
                            (lysp_ext_instance *)0x0,plVar30,parent,pnode,ctx->cur_mod,ctx->ext);
        if (lVar15 == '\0') break;
        if ((*dev_pnode == (lysp_node *)0x0) &&
           (LVar17 = lysp_dup_single(ctx,pnode,(ly_bool)dev_pnode,(lysp_node **)plVar30),
           LVar17 != LY_SUCCESS)) goto LAB_001517a2;
        pvVar27 = (void *)0x0;
LAB_0014f6b3:
        plVar7 = plVar6->prev;
        if (plVar7 == (lyd_node *)0x0) {
          pvVar31 = (void *)0x0;
        }
        else {
          pvVar31 = plVar7[-1].priv;
        }
        if (pvVar27 < pvVar31) {
          puVar8 = *(undefined8 **)(&plVar7->hash + (long)pvVar27 * 2);
          plVar9 = (lysp_module *)plVar6->schema;
          plVar10 = *dev_pnode;
          plVar11 = ctx->cur_mod;
          plVar12 = ctx->pmod;
          ctx->cur_mod = plVar9->mod;
          ctx->pmod = plVar9;
          lysc_update_path(ctx,(lys_module *)0x0,"{refine}");
          lysc_update_path(ctx,(lys_module *)0x0,(char *)*puVar8);
          lVar33 = puVar8[6];
          if (lVar33 != 0) {
            uVar16 = plVar10->nodetype;
            if (uVar16 == 2) {
              plVar42 = ctx->ctx;
              if (*(ulong *)(lVar33 + -8) < 2) {
                plVar47 = (lysp_node *)&plVar10[1].next;
                plVar29 = plVar10[1].next;
LAB_0014f95d:
                lydict_remove(plVar42,(char *)plVar29);
                LVar18 = lysp_qname_dup(ctx->ctx,(lysp_qname *)puVar8[6],(lysp_qname *)plVar47);
                if (LVar18 != LY_SUCCESS) goto LAB_0014ff76;
                goto LAB_0014f97d;
              }
LAB_0014f79b:
              pcVar25 = lys_nodetype2str(uVar16);
              if (puVar8[6] == 0) {
                pcVar45 = (char *)0x0;
              }
              else {
                pcVar45 = *(char **)(puVar8[6] + -8);
              }
              LVar38 = LYVE_SEMANTICS;
              pcVar32 = "Invalid %s of %s with too many (%lu) %s properties.";
              pcVar44 = "default";
LAB_0014ff65:
              ly_vlog(plVar42,(char *)0x0,LVar38,pcVar32,"refine",pcVar25,pcVar45,pcVar44);
            }
            else {
              if (uVar16 != 8) {
                if (uVar16 == 4) {
                  plVar42 = ctx->ctx;
                  if (1 < *(ulong *)(lVar33 + -8)) goto LAB_0014f79b;
                  plVar47 = plVar10 + 3;
                  plVar29 = plVar10[3].parent;
                  goto LAB_0014f95d;
                }
                plVar42 = ctx->ctx;
                pcVar25 = lys_nodetype2str(uVar16);
                pcVar44 = "default";
LAB_0014ff5c:
                LVar38 = LYVE_REFERENCE;
                pcVar32 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
                pcVar45 = "replace";
                goto LAB_0014ff65;
              }
              if (1 < *(byte *)(*(long *)(lVar33 + 8) + 0x78)) {
                lVar33 = 0;
                plVar46 = (lysp_ext_instance *)0x0;
                while( true ) {
                  plVar47 = plVar10[3].parent;
                  if (plVar47 == (lysp_node *)0x0) {
                    plVar22 = (lysp_ext_instance *)0x0;
                  }
                  else {
                    plVar22 = plVar47[-1].exts;
                  }
                  if (plVar22 <= plVar46) break;
                  lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar47->parent + lVar33));
                  plVar46 = (lysp_ext_instance *)((long)&plVar46->name + 1);
                  lVar33 = lVar33 + 0x18;
                }
                if (plVar47 != (lysp_node *)0x0) {
                  free(&plVar47[-1].exts);
                }
                plVar10[3].parent = (lysp_node *)0x0;
                uVar48 = 0xffffffffffffffff;
                lVar33 = 0;
                do {
                  if (puVar8[6] == 0) {
                    uVar23 = 0;
                  }
                  else {
                    uVar23 = *(ulong *)(puVar8[6] + -8);
                  }
                  uVar48 = uVar48 + 1;
                  if (uVar23 <= uVar48) goto LAB_0014f97d;
                  plVar47 = plVar10[3].parent;
                  if (plVar47 == (lysp_node *)0x0) {
                    puVar24 = (undefined8 *)malloc(0x20);
                    if (puVar24 == (undefined8 *)0x0) goto LAB_0014f8cc;
                    *puVar24 = 1;
LAB_0014f8ba:
                    plVar10[3].parent = (lysp_node *)(puVar24 + 1);
                    iVar20 = 0;
                    LVar18 = LY_SUCCESS;
                  }
                  else {
                    plVar46 = plVar47[-1].exts;
                    plVar47[-1].exts = (lysp_ext_instance *)((long)&plVar46->name + 1);
                    puVar24 = (undefined8 *)realloc(&plVar47[-1].exts,(long)plVar46 * 0x18 + 0x20);
                    if (puVar24 != (undefined8 *)0x0) goto LAB_0014f8ba;
                    pplVar1 = &plVar10[3].parent[-1].exts;
                    *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)[-1].exts + 7);
LAB_0014f8cc:
                    LVar18 = LY_EMEM;
                    ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                           "lys_apply_refine");
                    iVar20 = 3;
                  }
                  if (iVar20 != 0) goto LAB_0014fea9;
                  plVar47 = plVar10[3].parent;
                  plVar46 = plVar47[-1].exts;
                  plVar39 = (lysp_qname *)((long)plVar47 + (long)plVar46 * 0x18 + -0x18);
                  plVar39->str = (char *)0x0;
                  *(undefined8 *)((long)plVar47 + (long)plVar46 * 0x18 + -0x10) = 0;
                  *(undefined8 *)((long)plVar47 + (long)plVar46 * 0x18 + -8) = 0;
                  LVar18 = lysp_qname_dup(ctx->ctx,(lysp_qname *)(puVar8[6] + lVar33),plVar39);
                  lVar33 = lVar33 + 0x18;
                } while (LVar18 == LY_SUCCESS);
                goto LAB_0014ff76;
              }
              ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                      "Invalid refine of default in leaf-list - the default statement is allowed only in YANG 1.1 modules."
                     );
            }
            LVar18 = LY_EVALID;
            goto LAB_0014ff76;
          }
LAB_0014f97d:
          if (puVar8[1] != 0) {
            lydict_remove(ctx->ctx,plVar10->dsc);
            LVar18 = lydict_dup(ctx->ctx,(char *)puVar8[1],&plVar10->dsc);
            if (LVar18 == LY_SUCCESS) goto LAB_0014f9ad;
            goto LAB_0014ff76;
          }
LAB_0014f9ad:
          if (puVar8[2] != 0) {
            lydict_remove(ctx->ctx,plVar10->ref);
            LVar18 = lydict_dup(ctx->ctx,(char *)puVar8[2],&plVar10->ref);
            if (LVar18 != LY_SUCCESS) goto LAB_0014ff76;
          }
          if ((*(ushort *)(puVar8 + 9) & 3) != 0) {
            uVar21 = ctx->compile_opts;
            if ((uVar21 & 4) == 0) {
              plVar10->flags = *(ushort *)(puVar8 + 9) & 3 | plVar10->flags & 0xfffc;
            }
            else {
              pcVar25 = "notification";
              if ((uVar21 >> 0xe & 1) == 0) {
                pcVar25 = "a subtree ignoring config";
              }
              if ((uVar21 & 0x3000) != 0) {
                pcVar25 = "RPC/action";
              }
              ly_log(ctx->ctx,LY_LLWRN,LY_SUCCESS,"Refining config inside %s has no effect (%s).",
                     pcVar25,ctx->path);
            }
          }
          if ((*(ushort *)(puVar8 + 9) & 0x60) != 0) {
            uVar4 = plVar10->nodetype;
            if (((0x20 < (ulong)uVar4) || ((0x100000014U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) &&
               (uVar4 != 0x60)) {
              plVar42 = ctx->ctx;
              pcVar25 = lys_nodetype2str(uVar4);
              pcVar44 = "mandatory";
              goto LAB_0014ff5c;
            }
            plVar10->flags = *(ushort *)(puVar8 + 9) & 0x60 | plVar10->flags & 0xff9f;
          }
          if (puVar8[5] != 0) {
            plVar42 = ctx->ctx;
            if (plVar10->nodetype != 1) {
              pcVar25 = lys_nodetype2str(plVar10->nodetype);
              pcVar44 = "presence";
              goto LAB_0014ff5c;
            }
            lydict_remove(plVar42,(char *)plVar10[1].next);
            LVar18 = lydict_dup(ctx->ctx,(char *)puVar8[5],(char **)&plVar10[1].next);
            if (LVar18 != LY_SUCCESS) goto LAB_0014ff76;
          }
          if (puVar8[4] != 0) {
            uVar4 = plVar10->nodetype;
            if (((0x20 < (ulong)uVar4) || ((0x100010112U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) &&
               (uVar4 != 0x60)) {
              plVar42 = ctx->ctx;
              pcVar25 = lys_nodetype2str(uVar4);
              pcVar44 = "must";
LAB_0014ff21:
              LVar38 = LYVE_REFERENCE;
              pcVar32 = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
              pcVar45 = "add";
              goto LAB_0014ff65;
            }
            uVar48 = 0xffffffffffffffff;
            lVar33 = 0;
            do {
              if (puVar8[4] == 0) {
                uVar23 = 0;
              }
              else {
                uVar23 = *(ulong *)(puVar8[4] + -8);
              }
              uVar48 = uVar48 + 1;
              if (uVar23 <= uVar48) goto LAB_0014fc6b;
              plVar47 = plVar10[1].parent;
              if (plVar47 == (lysp_node *)0x0) {
                puVar24 = (undefined8 *)malloc(0x48);
                if (puVar24 == (undefined8 *)0x0) goto LAB_0014fbac;
                *puVar24 = 1;
LAB_0014fb9d:
                plVar10[1].parent = (lysp_node *)(puVar24 + 1);
                iVar20 = 0;
                LVar18 = LY_SUCCESS;
              }
              else {
                plVar46 = (lysp_ext_instance *)((long)&(plVar47[-1].exts)->name + 1);
                plVar47[-1].exts = plVar46;
                puVar24 = (undefined8 *)realloc(&plVar47[-1].exts,(long)plVar46 * 0x40 | 8);
                if (puVar24 != (undefined8 *)0x0) goto LAB_0014fb9d;
                pplVar1 = &plVar10[1].parent[-1].exts;
                *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)[-1].exts + 7);
LAB_0014fbac:
                LVar18 = LY_EMEM;
                ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lys_apply_refine");
                iVar20 = 3;
              }
              if (iVar20 != 0) goto LAB_0014fea9;
              plVar47 = plVar10[1].parent;
              plVar46 = plVar47[-1].exts;
              plVar47[(long)((long)&plVar46[-1].exts + 7)].iffeatures = (lysp_qname *)0x0;
              plVar47[(long)((long)&plVar46[-1].exts + 7)].exts = (lysp_ext_instance *)0x0;
              plVar47[(long)((long)&plVar46[-1].exts + 7)].dsc = (char *)0x0;
              plVar47[(long)((long)&plVar46[-1].exts + 7)].ref = (char *)0x0;
              plVar47[(long)((long)&plVar46[-1].exts + 7)].next = (lysp_node *)0x0;
              plVar47[(long)((long)&plVar46[-1].exts + 7)].name = (char *)0x0;
              plVar47[(long)((long)&plVar46[-1].exts + 7)].parent = (lysp_node *)0x0;
              plVar29 = plVar47 + (long)((long)&plVar46[-1].exts + 7);
              plVar29->nodetype = 0;
              plVar29->flags = 0;
              *(undefined4 *)&plVar29->field_0xc = 0;
              LVar18 = lysp_restr_dup(ctx->ctx,plVar9,(lysp_restr *)(puVar8[4] + lVar33),
                                      (lysp_restr *)(plVar47 + (long)((long)&plVar46[-1].exts + 7)))
              ;
              lVar33 = lVar33 + 0x40;
            } while (LVar18 == LY_SUCCESS);
            goto LAB_0014ff76;
          }
LAB_0014fc6b:
          uVar21 = *(uint *)(puVar8 + 9);
          if ((uVar21 >> 9 & 1) != 0) {
            uVar16 = plVar10->nodetype;
            if (uVar16 == 8) {
              lVar33 = 200;
            }
            else {
              if (uVar16 != 0x10) {
                plVar42 = ctx->ctx;
                pcVar25 = lys_nodetype2str(uVar16);
                pcVar44 = "min-elements";
                goto LAB_0014ff5c;
              }
              lVar33 = 0x88;
            }
            *(undefined4 *)((long)&plVar10->parent + lVar33) = *(undefined4 *)(puVar8 + 7);
          }
          if ((uVar21 >> 10 & 1) != 0) {
            uVar16 = plVar10->nodetype;
            if (uVar16 == 8) {
              lVar33 = 0xcc;
            }
            else {
              if (uVar16 != 0x10) {
                plVar42 = ctx->ctx;
                pcVar25 = lys_nodetype2str(uVar16);
                pcVar44 = "max-elements";
                goto LAB_0014ff5c;
              }
              lVar33 = 0x8c;
            }
            *(undefined4 *)((long)&plVar10->parent + lVar33) = *(undefined4 *)((long)puVar8 + 0x3c);
          }
          if (puVar8[3] != 0) {
            uVar4 = plVar10->nodetype;
            if (((0x20 < (ulong)uVar4) || ((0x100010116U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) &&
               ((uVar4 != 0x60 && (uVar4 != 0x80)))) {
              plVar42 = ctx->ctx;
              pcVar25 = lys_nodetype2str(uVar4);
              pcVar44 = "if-feature";
              goto LAB_0014ff21;
            }
            uVar48 = 0xffffffffffffffff;
            lVar33 = 0;
            do {
              if (puVar8[3] == 0) {
                uVar23 = 0;
              }
              else {
                uVar23 = *(ulong *)(puVar8[3] + -8);
              }
              uVar48 = uVar48 + 1;
              if (uVar23 <= uVar48) goto LAB_0014feb7;
              plVar39 = plVar10->iffeatures;
              if (plVar39 == (lysp_qname *)0x0) {
                puVar24 = (undefined8 *)malloc(0x20);
                if (puVar24 == (undefined8 *)0x0) goto LAB_0014fe27;
                *puVar24 = 1;
LAB_0014fe18:
                plVar10->iffeatures = (lysp_qname *)(puVar24 + 1);
                iVar20 = 0;
                LVar18 = LY_SUCCESS;
              }
              else {
                lVar13 = *(long *)&plVar39[-1].flags;
                *(long *)&plVar39[-1].flags = lVar13 + 1;
                puVar24 = (undefined8 *)realloc(&plVar39[-1].flags,lVar13 * 0x18 + 0x20);
                if (puVar24 != (undefined8 *)0x0) goto LAB_0014fe18;
                puVar36 = &plVar10->iffeatures[-1].flags;
                *(long *)puVar36 = *(long *)puVar36 + -1;
LAB_0014fe27:
                LVar18 = LY_EMEM;
                ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lys_apply_refine");
                iVar20 = 3;
              }
              if (iVar20 != 0) goto LAB_0014fea9;
              plVar39 = plVar10->iffeatures;
              lVar13 = *(long *)&plVar39[-1].flags;
              plVar39[lVar13 + -1].str = (char *)0x0;
              plVar39[lVar13 + -1].mod = (lysp_module *)0x0;
              *(undefined8 *)&plVar39[lVar13 + -1].flags = 0;
              LVar18 = lysp_qname_dup(ctx->ctx,(lysp_qname *)(puVar8[3] + lVar33),
                                      plVar39 + lVar13 + -1);
              lVar33 = lVar33 + 0x18;
            } while (LVar18 == LY_SUCCESS);
            goto LAB_0014ff76;
          }
LAB_0014feb7:
          lVar33 = puVar8[8];
          LVar18 = LY_SUCCESS;
          if (lVar33 == 0) goto LAB_0014ff76;
          plVar46 = plVar10->exts;
          if (plVar46 == (lysp_ext_instance *)0x0) {
            plVar22 = (lysp_ext_instance *)0x0;
            plVar26 = (long *)calloc(1,*(long *)(lVar33 + -8) * 0x70 | 8);
          }
          else {
            plVar22 = plVar46[-1].exts;
            plVar26 = (long *)realloc(&plVar46[-1].exts,
                                      ((long)&(plVar46[-1].exts)->name + *(long *)(lVar33 + -8)) *
                                      0x70 | 8);
          }
          if (plVar26 == (long *)0x0) {
            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_refine");
            bVar49 = false;
            LVar17 = LY_EMEM;
          }
          else {
            plVar10->exts = (lysp_ext_instance *)(plVar26 + 1);
            if (puVar8[8] == 0) {
              sVar40 = 0;
            }
            else {
              sVar40 = *(long *)(puVar8[8] + -8) * 0x70;
            }
            memset(plVar26 + *plVar26 * 0xe + 1,0,sVar40);
            uVar48 = 0xffffffffffffffff;
            lVar33 = 0;
            do {
              if (puVar8[8] == 0) {
                uVar23 = 0;
              }
              else {
                uVar23 = *(ulong *)(puVar8[8] + -8);
              }
              uVar48 = uVar48 + 1;
              bVar49 = uVar23 <= uVar48;
              LVar17 = LY_EMEM;
              if (bVar49) goto LAB_001500e9;
              pplVar1 = &plVar10->exts[-1].exts;
              *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
              plVar42 = ctx->ctx;
              lVar19 = lyplg_ext_nodetype2stmt(plVar10->nodetype);
              LVar17 = lysp_ext_dup(plVar42,plVar9,plVar10,lVar19,
                                    (lysp_ext_instance *)(puVar8[8] + lVar33),
                                    (lysp_ext_instance *)
                                    ((long)&plVar10->exts[(long)plVar22].name + lVar33));
              lVar33 = lVar33 + 0x70;
            } while (LVar17 == LY_SUCCESS);
            bVar49 = false;
          }
LAB_001500e9:
          if (bVar49) goto LAB_0014ff76;
          goto LAB_0014ffa3;
        }
        lysc_refine_free(ctx->ctx,(lysc_refine *)plVar6);
        ly_set_rm_index(&ctx->uses_rfns,(uint32_t)uVar41,(_func_void_void_ptr *)0x0);
        if ((ctx->uses_rfns).count <= uVar41) goto LAB_00150137;
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 < (ctx->uses_rfns).count);
  }
LAB_00150137:
  if ((ctx->devs).count != 0) {
    uVar41 = 0;
    do {
      plVar6 = (ctx->devs).field_2.dnodes[uVar41];
      pplVar34 = (lysp_node **)0x0;
      lVar15 = lysp_schema_nodeid_match
                         (*(lysc_nodeid **)plVar6,*(lysp_module **)&plVar6->parent->field_0,
                          (lysp_ext_instance *)0x0,(lysc_node *)0x0,parent,pnode,ctx->cur_mod,
                          ctx->ext);
      if (lVar15 != '\0') {
        if (*(ly_bool *)&plVar6->next != '\0') {
          *not_supported = '\x01';
          goto LAB_0015019f;
        }
        if ((*dev_pnode == (lysp_node *)0x0) &&
           (LVar17 = lysp_dup_single(ctx,pnode,(ly_bool)dev_pnode,pplVar34), LVar17 != LY_SUCCESS))
        goto LAB_001517a2;
        pcVar25 = ctx->path;
        pvVar27 = (void *)0x0;
        goto LAB_001501fa;
      }
      uVar41 = uVar41 + 1;
    } while (uVar41 < (ctx->devs).count);
  }
  LVar17 = LY_SUCCESS;
  goto LAB_001517a2;
LAB_0014fea9:
  LVar17 = (LY_ERR)lVar33;
  if (iVar20 == 3) {
LAB_0014ff76:
    LVar17 = LVar18;
    ctx->cur_mod = plVar11;
    ctx->pmod = plVar12;
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
  }
LAB_0014ffa3:
  pvVar27 = (void *)((long)pvVar27 + 1);
  if (LVar17 != LY_SUCCESS) goto LAB_001517a2;
  goto LAB_0014f6b3;
LAB_0015019f:
  lysc_deviation_free(ctx->ctx,(lysc_deviation *)plVar6);
  LVar17 = LY_SUCCESS;
  ly_set_rm_index(&ctx->devs,(uint32_t)uVar41,(_func_void_void_ptr *)0x0);
  goto LAB_001517a2;
LAB_001501fa:
  do {
    plVar30 = plVar6->schema;
    if (plVar30 == (lysc_node *)0x0) {
      pvVar31 = (void *)0x0;
    }
    else {
      pvVar31 = plVar30[-1].priv;
    }
    if (pvVar31 <= pvVar27) goto LAB_0015019f;
    puVar8 = *(undefined8 **)(plVar30->hash + (long)pvVar27 * 8 + -4);
    plVar9 = *(lysp_module **)((long)&plVar6->parent->field_0 + (long)pvVar27 * 8);
    plVar10 = *dev_pnode;
    plVar11 = ctx->cur_mod;
    plVar12 = ctx->pmod;
    strcpy(local_1028,pcVar25);
    ctx->path_len = 1;
    ctx->cur_mod = plVar9->mod;
    ctx->pmod = plVar9;
    lysc_update_path(ctx,(lys_module *)0x0,"{deviation}");
    lysc_update_path(ctx,(lys_module *)0x0,(char *)*puVar8);
    pcVar45 = (char *)puVar8[3];
    if (pcVar45 != (char *)0x0) {
      pplVar34 = &plVar10[1].next;
      pplVar1 = &plVar10[2].exts;
      plVar47 = plVar10 + 3;
      do {
        cVar3 = *pcVar45;
        puVar37 = (uint *)&plVar10[3].field_0xc;
        if (cVar3 == '\x04') {
          if (*(long *)(pcVar45 + 0x18) != 0) {
            uVar16 = plVar10->nodetype;
            if ((uVar16 == 4) || (uVar16 == 8)) {
              lysp_type_free(&ctx->free_ctx,(lysp_type *)pplVar34);
              lysp_type_dup(ctx->ctx,ctx->pmod,*(lysp_type **)(pcVar45 + 0x18),(lysp_type *)pplVar34
                           );
              goto LAB_00150434;
            }
            plVar42 = ctx->ctx;
            pcVar32 = lys_nodetype2str(uVar16);
LAB_001511c4:
            pcVar43 = "deviation";
            LVar38 = LYVE_REFERENCE;
            format = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
            pcVar44 = "replace";
            goto LAB_001511cf;
          }
LAB_00150434:
          pcVar44 = *(char **)(pcVar45 + 0x20);
          if ((lysp_ext_instance *)pcVar44 != (lysp_ext_instance *)0x0) {
            uVar16 = plVar10->nodetype;
            if ((uVar16 == 4) || (uVar16 == 8)) {
              plVar42 = ctx->ctx;
              if (*pplVar1 != (lysp_ext_instance *)0x0) {
                lydict_remove(plVar42,(char *)*pplVar1);
                LVar18 = lydict_dup(ctx->ctx,*(char **)(pcVar45 + 0x20),(char **)pplVar1);
                if (LVar18 != LY_SUCCESS) goto LAB_001511dd;
                goto LAB_00150482;
              }
              pcVar32 = "units";
LAB_00150d20:
              pcVar43 = "replacing";
              LVar38 = LYVE_REFERENCE;
              format = "Invalid deviation %s \"%s\" property \"%s\" which is not present.";
              goto LAB_001511cf;
            }
            plVar42 = ctx->ctx;
            pcVar32 = lys_nodetype2str(uVar16);
            goto LAB_001511c4;
          }
LAB_00150482:
          pcVar44 = *(char **)(pcVar45 + 0x28);
          if ((lysp_ext_instance *)pcVar44 != (lysp_ext_instance *)0x0) {
            uVar16 = plVar10->nodetype;
            plVar29 = (lysp_node *)pplVar34;
            if ((uVar16 != 2) && (plVar29 = plVar47, uVar16 != 4)) {
              plVar42 = ctx->ctx;
              pcVar32 = lys_nodetype2str(uVar16);
              goto LAB_001511c4;
            }
            plVar42 = ctx->ctx;
            if (plVar29->parent == (lysp_node *)0x0) {
              pcVar32 = "default";
              goto LAB_00150d20;
            }
            lydict_remove(plVar42,(char *)plVar29->parent);
            LVar18 = lysp_qname_dup(ctx->ctx,(lysp_qname *)(pcVar45 + 0x28),(lysp_qname *)plVar29);
            if (LVar18 != LY_SUCCESS) goto LAB_001511dd;
          }
          uVar4 = *(ushort *)(pcVar45 + 0x40);
          if ((uVar4 & 3) != 0) {
            uVar5 = plVar10->nodetype;
            if (((0x20 < (ulong)uVar5) || ((0x100010116U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) &&
               (uVar5 != 0x60)) {
              plVar42 = ctx->ctx;
              pcVar32 = lys_nodetype2str(uVar5);
              goto LAB_001511c4;
            }
            plVar10->flags = uVar4 & 3 | plVar10->flags & 0xfffc;
          }
          if ((uVar4 & 0x60) != 0) {
            uVar5 = plVar10->nodetype;
            if (((0x20 < (ulong)uVar5) || ((0x100000014U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) &&
               (uVar5 != 0x60)) {
              plVar42 = ctx->ctx;
              pcVar32 = lys_nodetype2str(uVar5);
              goto LAB_001511c4;
            }
            plVar10->flags = uVar4 & 0x60 | plVar10->flags & 0xff9f;
          }
          if ((uVar4 >> 9 & 1) != 0) {
            uVar16 = plVar10->nodetype;
            puVar36 = &plVar10[3].nodetype;
            if ((uVar16 != 8) && (puVar36 = &plVar10[2].nodetype, uVar16 != 0x10)) {
              plVar42 = ctx->ctx;
              pcVar32 = lys_nodetype2str(uVar16);
              goto LAB_001511c4;
            }
            *(undefined4 *)puVar36 = *(undefined4 *)(pcVar45 + 0x44);
          }
          if ((uVar4 >> 10 & 1) != 0) {
            uVar16 = plVar10->nodetype;
            if ((uVar16 != 8) && (puVar37 = (uint *)&plVar10[2].field_0xc, uVar16 != 0x10)) {
              plVar42 = ctx->ctx;
              pcVar32 = lys_nodetype2str(uVar16);
              goto LAB_001511c4;
            }
            uVar21 = *(uint *)(pcVar45 + 0x48);
LAB_00150c84:
            *puVar37 = uVar21;
          }
LAB_00150c86:
          LVar18 = LY_SUCCESS;
        }
        else {
          if (cVar3 == '\x03') {
            pcVar44 = *(char **)(pcVar45 + 0x18);
            if ((lysp_ext_instance *)pcVar44 == (lysp_ext_instance *)0x0) {
LAB_001509e8:
              if (*(long *)(pcVar45 + 0x20) == 0) {
                LVar18 = LY_SUCCESS;
LAB_00150dbb:
                if (*(long *)(pcVar45 + 0x28) == 0) {
LAB_00150f4a:
                  puVar24 = *(undefined8 **)(pcVar45 + 0x30);
                  if (puVar24 != (undefined8 *)0x0) {
                    uVar16 = plVar10->nodetype;
                    if (uVar16 == 2) {
                      if (1 < (ulong)puVar24[-1]) goto LAB_00151218;
                      plVar46 = (lysp_ext_instance *)*pplVar34;
                      if (plVar46 == (lysp_ext_instance *)0x0) {
LAB_001512c3:
                        plVar42 = ctx->ctx;
                        LVar38 = LYVE_REFERENCE;
                        format = "Invalid deviation %s \"%s\" property \"%s\" which is not present."
                        ;
                        pcVar43 = "deleting";
                        pcVar32 = "default";
                        pcVar44 = (char *)*puVar24;
                        goto LAB_001511cf;
                      }
                      pcVar32 = (char *)*puVar24;
                      iVar20 = strcmp((char *)plVar46,pcVar32);
                      plVar42 = ctx->ctx;
                      if (iVar20 != 0) {
LAB_00151106:
                        pcVar43 = "default";
                        goto LAB_001503eb;
                      }
                      lydict_remove(plVar42,(char *)plVar46);
                      plVar29 = (lysp_node *)pplVar34;
LAB_00151508:
                      plVar29->parent = (lysp_node *)0x0;
                    }
                    else {
                      if (uVar16 == 4) {
                        if ((ulong)puVar24[-1] < 2) {
                          plVar46 = (lysp_ext_instance *)plVar47->parent;
                          if (plVar46 == (lysp_ext_instance *)0x0) goto LAB_001512c3;
                          pcVar32 = (char *)*puVar24;
                          iVar20 = strcmp((char *)plVar46,pcVar32);
                          plVar42 = ctx->ctx;
                          if (iVar20 != 0) goto LAB_00151106;
                          lydict_remove(plVar42,(char *)plVar46);
                          plVar29 = plVar47;
                          goto LAB_00151508;
                        }
                        goto LAB_00151218;
                      }
                      if (uVar16 != 8) {
                        plVar42 = ctx->ctx;
                        pcVar32 = lys_nodetype2str(uVar16);
                        goto LAB_00151157;
                      }
                      uVar48 = 0;
                      do {
                        lVar33 = *(long *)(pcVar45 + 0x30);
                        if (lVar33 == 0) {
                          uVar23 = 0;
                        }
                        else {
                          uVar23 = *(ulong *)(lVar33 + -8);
                        }
                        plVar29 = plVar47->parent;
                        if (uVar23 <= uVar48) {
                          if (plVar29 != (lysp_node *)0x0) {
                            if (plVar29[-1].exts != (lysp_ext_instance *)0x0) break;
                            free(&plVar29[-1].exts);
                          }
                          plVar47->parent = (lysp_node *)0x0;
                          break;
                        }
                        puVar24 = (undefined8 *)(lVar33 + uVar48 * 0x18);
                        lVar33 = 0;
                        plVar46 = (lysp_ext_instance *)0x0;
                        while( true ) {
                          if (plVar29 == (lysp_node *)0x0) {
                            plVar22 = (lysp_ext_instance *)0x0;
                          }
                          else {
                            plVar22 = plVar29[-1].exts;
                          }
                          if (plVar22 <= plVar46) {
                            ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                                    "Invalid deviation deleting \"%s\" property \"%s\" which does not match any of the target\'s property values."
                                    ,"default",*puVar24);
                            LVar18 = LY_EVALID;
                            goto LAB_00151076;
                          }
                          iVar20 = strcmp((char *)*puVar24,
                                          *(char **)((long)&plVar29->parent + lVar33));
                          if (iVar20 == 0) break;
                          plVar46 = (lysp_ext_instance *)((long)&plVar46->name + 1);
                          lVar33 = lVar33 + 0x18;
                        }
                        plVar29[-1].exts =
                             (lysp_ext_instance *)((long)&plVar29[-1].exts[-1].exts + 7);
                        lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar29->parent + lVar33));
                        plVar29 = plVar47->parent;
                        if (plVar29 == (lysp_node *)0x0) {
                          plVar35 = (lysp_ext_instance *)0x0;
                        }
                        else {
                          plVar35 = plVar29[-1].exts;
                        }
                        if (plVar46 < plVar35) {
                          if (plVar29 == (lysp_node *)0x0) {
                            plVar35 = (lysp_ext_instance *)0x0;
                          }
                          else {
                            plVar35 = plVar29[-1].exts;
                          }
                          memmove((void *)((long)&plVar29->parent + lVar33),
                                  (void *)((long)&plVar29->name + lVar33),
                                  ((long)plVar35 - (long)plVar46) * 0x18);
                        }
LAB_00151076:
                        uVar48 = uVar48 + 1;
                      } while (plVar46 < plVar22);
                    }
                  }
                }
                else {
                  if (plVar10->nodetype != 0x10) {
                    plVar42 = ctx->ctx;
                    pcVar32 = lys_nodetype2str(plVar10->nodetype);
                    goto LAB_00151157;
                  }
                  uVar48 = 0;
                  do {
                    lVar33 = *(long *)(pcVar45 + 0x28);
                    if (lVar33 == 0) {
                      uVar23 = 0;
                    }
                    else {
                      uVar23 = *(ulong *)(lVar33 + -8);
                    }
                    plVar29 = plVar10[2].parent;
                    if (uVar23 <= uVar48) {
                      if (plVar29 != (lysp_node *)0x0) {
                        if (plVar29[-1].exts != (lysp_ext_instance *)0x0) goto LAB_00150f4a;
                        free(&plVar29[-1].exts);
                      }
                      plVar10[2].parent = (lysp_node *)0x0;
                      goto LAB_00150f4a;
                    }
                    puVar24 = (undefined8 *)(lVar33 + uVar48 * 0x18);
                    lVar33 = 0;
                    plVar46 = (lysp_ext_instance *)0x0;
                    while( true ) {
                      if (plVar29 == (lysp_node *)0x0) {
                        plVar22 = (lysp_ext_instance *)0x0;
                      }
                      else {
                        plVar22 = plVar29[-1].exts;
                      }
                      if (plVar22 <= plVar46) {
                        ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                                "Invalid deviation deleting \"%s\" property \"%s\" which does not match any of the target\'s property values."
                                ,"unique",*puVar24);
                        LVar18 = LY_EVALID;
                        goto LAB_00150edb;
                      }
                      iVar20 = strcmp((char *)*puVar24,*(char **)((long)&plVar29->parent + lVar33));
                      if (iVar20 == 0) break;
                      plVar46 = (lysp_ext_instance *)((long)&plVar46->name + 1);
                      lVar33 = lVar33 + 0x18;
                    }
                    plVar29[-1].exts = (lysp_ext_instance *)((long)&plVar29[-1].exts[-1].exts + 7);
                    lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar29->parent + lVar33));
                    plVar29 = plVar10[2].parent;
                    if (plVar29 == (lysp_node *)0x0) {
                      plVar35 = (lysp_ext_instance *)0x0;
                    }
                    else {
                      plVar35 = plVar29[-1].exts;
                    }
                    if (plVar46 < plVar35) {
                      if (plVar29 == (lysp_node *)0x0) {
                        plVar35 = (lysp_ext_instance *)0x0;
                      }
                      else {
                        plVar35 = plVar29[-1].exts;
                      }
                      memmove((void *)((long)&plVar29->parent + lVar33),
                              (void *)((long)&plVar29->name + lVar33),
                              ((long)plVar35 - (long)plVar46) * 0x18);
                    }
LAB_00150edb:
                    uVar48 = uVar48 + 1;
                  } while (plVar46 < plVar22);
                }
              }
              else {
                pplVar28 = lysp_node_musts_p(plVar10);
                if (pplVar28 == (lysp_restr **)0x0) {
                  plVar42 = ctx->ctx;
                  pcVar32 = lys_nodetype2str(plVar10->nodetype);
                  goto LAB_00151157;
                }
                uVar48 = 0;
                LVar18 = LY_SUCCESS;
                do {
                  lVar33 = *(long *)(pcVar45 + 0x20);
                  if (lVar33 == 0) {
                    uVar23 = 0;
                  }
                  else {
                    uVar23 = *(ulong *)(lVar33 + -8);
                  }
                  plVar14 = *pplVar28;
                  if (uVar23 <= uVar48) {
                    if (plVar14 != (lysp_restr *)0x0) {
                      if (plVar14[-1].exts != (lysp_ext_instance *)0x0) goto LAB_00150dbb;
                      free(&plVar14[-1].exts);
                    }
                    *pplVar28 = (lysp_restr *)0x0;
                    goto LAB_00150dbb;
                  }
                  puVar24 = (undefined8 *)(lVar33 + uVar48 * 0x40);
                  lVar33 = 0;
                  plVar46 = (lysp_ext_instance *)0x0;
                  while( true ) {
                    if (plVar14 == (lysp_restr *)0x0) {
                      plVar22 = (lysp_ext_instance *)0x0;
                    }
                    else {
                      plVar22 = plVar14[-1].exts;
                    }
                    if (plVar22 <= plVar46) {
                      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
                              "Invalid deviation deleting \"%s\" property \"%s\" which does not match any of the target\'s property values."
                              ,"must",*puVar24);
                      LVar18 = LY_EVALID;
                      goto LAB_00150afc;
                    }
                    iVar20 = strcmp((char *)*puVar24,*(char **)((long)&(plVar14->arg).str + lVar33))
                    ;
                    if (iVar20 == 0) break;
                    plVar46 = (lysp_ext_instance *)((long)&plVar46->name + 1);
                    lVar33 = lVar33 + 0x40;
                  }
                  plVar14[-1].exts = (lysp_ext_instance *)((long)&plVar14[-1].exts[-1].exts + 7);
                  lysp_restr_free(&ctx->free_ctx,(lysp_restr *)((long)&(plVar14->arg).str + lVar33))
                  ;
                  plVar14 = *pplVar28;
                  if (plVar14 == (lysp_restr *)0x0) {
                    plVar35 = (lysp_ext_instance *)0x0;
                  }
                  else {
                    plVar35 = plVar14[-1].exts;
                  }
                  if (plVar46 < plVar35) {
                    if (plVar14 == (lysp_restr *)0x0) {
                      plVar35 = (lysp_ext_instance *)0x0;
                    }
                    else {
                      plVar35 = plVar14[-1].exts;
                    }
                    memmove((void *)((long)&(plVar14->arg).str + lVar33),
                            (void *)((long)&plVar14[1].arg.str + lVar33),
                            ((long)plVar35 - (long)plVar46) * 0x40);
                  }
LAB_00150afc:
                  uVar48 = uVar48 + 1;
                } while (plVar46 < plVar22);
              }
              goto LAB_001511dd;
            }
            uVar16 = plVar10->nodetype;
            if ((uVar16 == 4) || (uVar16 == 8)) {
              plVar46 = *pplVar1;
              if (plVar46 == (lysp_ext_instance *)0x0) {
                plVar42 = ctx->ctx;
                LVar38 = LYVE_REFERENCE;
                format = "Invalid deviation %s \"%s\" property \"%s\" which is not present.";
                pcVar43 = "deleting";
                pcVar32 = "units";
              }
              else {
                iVar20 = strcmp((char *)plVar46,pcVar44);
                plVar42 = ctx->ctx;
                if (iVar20 == 0) {
                  lydict_remove(plVar42,(char *)plVar46);
                  *pplVar1 = (lysp_ext_instance *)0x0;
                  goto LAB_001509e8;
                }
                pcVar43 = "units";
                pcVar32 = pcVar44;
LAB_001503eb:
                LVar38 = LYVE_REFERENCE;
                format = 
                "Invalid deviation deleting \"%s\" property \"%s\" which does not match the target\'s property value \"%s\"."
                ;
                pcVar44 = (char *)plVar46;
              }
            }
            else {
              plVar42 = ctx->ctx;
              pcVar32 = lys_nodetype2str(uVar16);
LAB_00151157:
              pcVar43 = "deviation";
              LVar38 = LYVE_REFERENCE;
              format = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
              pcVar44 = "delete";
            }
LAB_001511cf:
            ly_vlog(plVar42,(char *)0x0,LVar38,format,pcVar43,pcVar32,pcVar44);
          }
          else {
            if (cVar3 != '\x02') {
              ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
                     ,0x62f);
              LVar18 = LY_EINT;
              goto LAB_001511dd;
            }
            if (*(char **)(pcVar45 + 0x18) == (char *)0x0) {
LAB_001505f1:
              if (*(long *)(pcVar45 + 0x20) == 0) {
LAB_00150715:
                if (*(long *)(pcVar45 + 0x28) != 0) {
                  if (plVar10->nodetype != 0x10) {
                    plVar42 = ctx->ctx;
                    pcVar32 = lys_nodetype2str(plVar10->nodetype);
                    goto LAB_00150cf2;
                  }
                  uVar48 = 0xffffffffffffffff;
                  lVar33 = 0;
                  do {
                    if (*(long *)(pcVar45 + 0x28) == 0) {
                      uVar23 = 0;
                    }
                    else {
                      uVar23 = *(ulong *)(*(long *)(pcVar45 + 0x28) + -8);
                    }
                    uVar48 = uVar48 + 1;
                    if (uVar23 <= uVar48) goto LAB_00150869;
                    plVar29 = plVar10[2].parent;
                    if (plVar29 == (lysp_node *)0x0) {
                      puVar24 = (undefined8 *)malloc(0x20);
                      if (puVar24 == (undefined8 *)0x0) goto LAB_001507c6;
                      *puVar24 = 1;
LAB_001507b5:
                      plVar10[2].parent = (lysp_node *)(puVar24 + 1);
                      bVar49 = true;
                      LVar18 = LY_SUCCESS;
                    }
                    else {
                      plVar46 = plVar29[-1].exts;
                      plVar29[-1].exts = (lysp_ext_instance *)((long)&plVar46->name + 1);
                      puVar24 = (undefined8 *)realloc(&plVar29[-1].exts,(long)plVar46 * 0x18 + 0x20)
                      ;
                      if (puVar24 != (undefined8 *)0x0) goto LAB_001507b5;
                      pplVar2 = &plVar10[2].parent[-1].exts;
                      *pplVar2 = (lysp_ext_instance *)((long)&(*pplVar2)[-1].exts + 7);
LAB_001507c6:
                      bVar49 = false;
                      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                             "lys_apply_deviate_add");
                      LVar18 = LY_EMEM;
                    }
                    if (!bVar49) break;
                    plVar29 = plVar10[2].parent;
                    plVar46 = plVar29[-1].exts;
                    plVar39 = (lysp_qname *)((long)plVar29 + (long)plVar46 * 0x18 + -0x18);
                    plVar39->str = (char *)0x0;
                    *(undefined8 *)((long)plVar29 + (long)plVar46 * 0x18 + -0x10) = 0;
                    *(undefined8 *)((long)plVar29 + (long)plVar46 * 0x18 + -8) = 0;
                    LVar18 = lysp_qname_dup(ctx->ctx,(lysp_qname *)
                                                     (*(long *)(pcVar45 + 0x28) + lVar33),plVar39);
                    lVar33 = lVar33 + 0x18;
                  } while (LVar18 == LY_SUCCESS);
                  goto LAB_001511dd;
                }
LAB_00150869:
                plVar39 = *(lysp_qname **)(pcVar45 + 0x30);
                if (plVar39 != (lysp_qname *)0x0) {
                  uVar16 = plVar10->nodetype;
                  if (uVar16 == 2) {
                    uVar48 = *(ulong *)&plVar39[-1].flags;
                    plVar29 = (lysp_node *)pplVar34;
                  }
                  else {
                    if (uVar16 != 4) {
                      if (uVar16 != 8) {
                        plVar42 = ctx->ctx;
                        pcVar32 = lys_nodetype2str(uVar16);
                        goto LAB_00150cf2;
                      }
                      uVar48 = 0xffffffffffffffff;
                      lVar33 = 0;
                      do {
                        if (*(long *)(pcVar45 + 0x30) == 0) {
                          uVar23 = 0;
                        }
                        else {
                          uVar23 = *(ulong *)(*(long *)(pcVar45 + 0x30) + -8);
                        }
                        uVar48 = uVar48 + 1;
                        if (uVar23 <= uVar48) goto LAB_00151329;
                        plVar29 = plVar47->parent;
                        if (plVar29 == (lysp_node *)0x0) {
                          puVar24 = (undefined8 *)malloc(0x20);
                          if (puVar24 == (undefined8 *)0x0) goto LAB_00150921;
                          *puVar24 = 1;
LAB_00150914:
                          plVar47->parent = (lysp_node *)(puVar24 + 1);
                          bVar49 = true;
                          LVar18 = LY_SUCCESS;
                        }
                        else {
                          plVar46 = plVar29[-1].exts;
                          plVar29[-1].exts = (lysp_ext_instance *)((long)&plVar46->name + 1);
                          puVar24 = (undefined8 *)
                                    realloc(&plVar29[-1].exts,(long)plVar46 * 0x18 + 0x20);
                          if (puVar24 != (undefined8 *)0x0) goto LAB_00150914;
                          pplVar2 = &plVar47->parent[-1].exts;
                          *pplVar2 = (lysp_ext_instance *)((long)&(*pplVar2)[-1].exts + 7);
LAB_00150921:
                          bVar49 = false;
                          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                                 "lys_apply_deviate_add");
                          LVar18 = LY_EMEM;
                        }
                        if (!bVar49) break;
                        plVar39 = (lysp_qname *)
                                  ((long)plVar47->parent +
                                  (long)plVar47->parent[-1].exts * 0x18 + -0x18);
                        plVar39->str = (char *)0x0;
                        plVar39->mod = (lysp_module *)0x0;
                        *(undefined8 *)&plVar39->flags = 0;
                        LVar18 = lysp_qname_dup(ctx->ctx,(lysp_qname *)
                                                         (lVar33 + *(long *)(pcVar45 + 0x30)),
                                                plVar39);
                        lVar33 = lVar33 + 0x18;
                      } while (LVar18 == LY_SUCCESS);
                      goto LAB_001511dd;
                    }
                    uVar48 = *(ulong *)&plVar39[-1].flags;
                    plVar29 = plVar47;
                  }
                  if (1 < uVar48) {
LAB_00151218:
                    plVar42 = ctx->ctx;
                    pcVar32 = lys_nodetype2str(uVar16);
                    if (*(long *)(pcVar45 + 0x30) == 0) {
                      pcVar44 = (char *)0x0;
                    }
                    else {
                      pcVar44 = *(char **)(*(long *)(pcVar45 + 0x30) + -8);
                    }
                    LVar38 = LYVE_SEMANTICS;
                    format = "Invalid %s of %s with too many (%lu) %s properties.";
                    pcVar43 = "deviation";
                    goto LAB_001511cf;
                  }
                  plVar42 = ctx->ctx;
                  if (plVar29->parent != (lysp_node *)0x0) {
                    pcVar32 = "default";
                    goto LAB_0015037b;
                  }
                  LVar18 = lysp_qname_dup(plVar42,plVar39,(lysp_qname *)plVar29);
                  if (LVar18 != LY_SUCCESS) goto LAB_001511dd;
                }
LAB_00151329:
                uVar4 = *(ushort *)(pcVar45 + 0x38);
                if ((uVar4 & 3) != 0) {
                  uVar5 = plVar10->nodetype;
                  if (((0x20 < (ulong)uVar5) || ((0x100010116U >> ((ulong)uVar5 & 0x3f) & 1) == 0))
                     && (uVar5 != 0x60)) {
                    plVar42 = ctx->ctx;
                    pcVar32 = lys_nodetype2str(uVar5);
                    goto LAB_00150cf2;
                  }
                  uVar5 = plVar10->flags;
                  if ((uVar5 & 3) == 0) {
                    plVar10->flags = uVar5 | uVar4 & 3;
                    goto LAB_00151396;
                  }
                  plVar42 = ctx->ctx;
                  pcVar32 = "true";
                  if ((uVar5 & 1) == 0) {
                    pcVar32 = "false";
                  }
                  pcVar44 = 
                  "Invalid deviation adding \"config\" property which already exists (with value \"config %s\")."
                  ;
LAB_001513f7:
                  ly_vlog(plVar42,(char *)0x0,LYVE_REFERENCE,pcVar44,pcVar32);
                  goto LAB_001511d8;
                }
LAB_00151396:
                if ((uVar4 & 0x60) != 0) {
                  uVar5 = plVar10->nodetype;
                  if (((0x20 < (ulong)uVar5) || ((0x100000014U >> ((ulong)uVar5 & 0x3f) & 1) == 0))
                     && (uVar5 != 0x60)) {
                    plVar42 = ctx->ctx;
                    pcVar32 = lys_nodetype2str(uVar5);
                    goto LAB_00150cf2;
                  }
                  uVar5 = plVar10->flags;
                  if ((uVar5 & 0x60) != 0) {
                    plVar42 = ctx->ctx;
                    pcVar32 = "true";
                    if ((uVar5 & 0x20) == 0) {
                      pcVar32 = "false";
                    }
                    pcVar44 = 
                    "Invalid deviation adding \"mandatory\" property which already exists (with value \"mandatory %s\")."
                    ;
                    goto LAB_001513f7;
                  }
                  plVar10->flags = uVar5 | uVar4 & 0x60;
                }
                if ((uVar4 >> 9 & 1) != 0) {
                  uVar16 = plVar10->nodetype;
                  puVar36 = &plVar10[3].nodetype;
                  if ((uVar16 != 8) && (puVar36 = &plVar10[2].nodetype, uVar16 != 0x10)) {
                    plVar42 = ctx->ctx;
                    pcVar32 = lys_nodetype2str(uVar16);
                    goto LAB_00150cf2;
                  }
                  if ((plVar10->flags & 0x200) == 0) {
                    *(uint *)puVar36 = *(uint *)(pcVar45 + 0x3c);
                    goto LAB_00151485;
                  }
                  plVar42 = ctx->ctx;
                  uVar21 = *(uint *)puVar36;
                  pcVar32 = 
                  "Invalid deviation adding \"min-elements\" property which already exists (with value \"%u\")."
                  ;
LAB_0015157e:
                  ly_vlog(plVar42,(char *)0x0,LYVE_REFERENCE,pcVar32,(ulong)uVar21);
                  goto LAB_001511d8;
                }
LAB_00151485:
                if ((uVar4 >> 10 & 1) != 0) {
                  uVar16 = plVar10->nodetype;
                  if ((uVar16 != 8) && (puVar37 = (uint *)&plVar10[2].field_0xc, uVar16 != 0x10)) {
                    plVar42 = ctx->ctx;
                    pcVar32 = lys_nodetype2str(uVar16);
                    goto LAB_00150cf2;
                  }
                  if ((plVar10->flags & 0x400) != 0) {
                    uVar21 = *puVar37;
                    plVar42 = ctx->ctx;
                    if (uVar21 == 0) {
                      ly_vlog(plVar42,(char *)0x0,LYVE_REFERENCE,
                              "Invalid deviation adding \"max-elements\" property which already exists (with value \"unbounded\")."
                             );
                      goto LAB_001511d8;
                    }
                    pcVar32 = 
                    "Invalid deviation adding \"max-elements\" property which already exists (with value \"%u\")."
                    ;
                    goto LAB_0015157e;
                  }
                  uVar21 = *(uint *)(pcVar45 + 0x40);
                  goto LAB_00150c84;
                }
                goto LAB_00150c86;
              }
              pplVar28 = lysp_node_musts_p(plVar10);
              if (pplVar28 == (lysp_restr **)0x0) {
                plVar42 = ctx->ctx;
                pcVar32 = lys_nodetype2str(plVar10->nodetype);
                goto LAB_00150cf2;
              }
              uVar48 = 0xffffffffffffffff;
              lVar33 = 0;
              do {
                if (*(long *)(pcVar45 + 0x20) == 0) {
                  uVar23 = 0;
                }
                else {
                  uVar23 = *(ulong *)(*(long *)(pcVar45 + 0x20) + -8);
                }
                uVar48 = uVar48 + 1;
                if (uVar23 <= uVar48) goto LAB_00150715;
                plVar14 = *pplVar28;
                if (plVar14 == (lysp_restr *)0x0) {
                  puVar24 = (undefined8 *)malloc(0x48);
                  if (puVar24 == (undefined8 *)0x0) goto LAB_00150694;
                  *puVar24 = 1;
LAB_00150686:
                  *pplVar28 = (lysp_restr *)(puVar24 + 1);
                  bVar49 = true;
                  LVar18 = LY_SUCCESS;
                }
                else {
                  plVar46 = (lysp_ext_instance *)((long)&(plVar14[-1].exts)->name + 1);
                  plVar14[-1].exts = plVar46;
                  puVar24 = (undefined8 *)realloc(&plVar14[-1].exts,(long)plVar46 * 0x40 | 8);
                  if (puVar24 != (undefined8 *)0x0) goto LAB_00150686;
                  (*pplVar28)[-1].exts =
                       (lysp_ext_instance *)((long)&(*pplVar28)[-1].exts[-1].exts + 7);
LAB_00150694:
                  bVar49 = false;
                  ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lys_apply_deviate_add");
                  LVar18 = LY_EMEM;
                }
                if (!bVar49) break;
                plVar14 = *pplVar28;
                plVar46 = plVar14[-1].exts;
                plVar14[(long)((long)&plVar46[-1].exts + 7)].ref = (char *)0x0;
                plVar14[(long)((long)&plVar46[-1].exts + 7)].exts = (lysp_ext_instance *)0x0;
                plVar14[(long)((long)&plVar46[-1].exts + 7)].eapptag = (char *)0x0;
                plVar14[(long)((long)&plVar46[-1].exts + 7)].dsc = (char *)0x0;
                *(undefined8 *)&plVar14[(long)((long)&plVar46[-1].exts + 7)].arg.flags = 0;
                plVar14[(long)((long)&plVar46[-1].exts + 7)].emsg = (char *)0x0;
                plVar14[(long)((long)&plVar46[-1].exts + 7)].arg.str = (char *)0x0;
                plVar14[(long)((long)&plVar46[-1].exts + 7)].arg.mod = (lysp_module *)0x0;
                LVar18 = lysp_restr_dup(ctx->ctx,ctx->pmod,
                                        (lysp_restr *)(*(long *)(pcVar45 + 0x20) + lVar33),
                                        plVar14 + (long)((long)&plVar46[-1].exts + 7));
                lVar33 = lVar33 + 0x40;
              } while (LVar18 == LY_SUCCESS);
              goto LAB_001511dd;
            }
            uVar16 = plVar10->nodetype;
            if ((uVar16 != 4) && (uVar16 != 8)) {
              plVar42 = ctx->ctx;
              pcVar32 = lys_nodetype2str(uVar16);
LAB_00150cf2:
              pcVar43 = "deviation";
              LVar38 = LYVE_REFERENCE;
              format = "Invalid %s of %s node - it is not possible to %s \"%s\" property.";
              pcVar44 = "add";
              goto LAB_001511cf;
            }
            plVar42 = ctx->ctx;
            if (*pplVar1 == (lysp_ext_instance *)0x0) {
              LVar18 = lydict_dup(plVar42,*(char **)(pcVar45 + 0x18),(char **)pplVar1);
              if (LVar18 != LY_SUCCESS) goto LAB_001511dd;
              goto LAB_001505f1;
            }
            pcVar32 = "units";
LAB_0015037b:
            ly_vlog(plVar42,(char *)0x0,LYVE_REFERENCE,
                    "Invalid deviation adding \"%s\" property which already exists (with value \"%s\")."
                    ,pcVar32);
          }
LAB_001511d8:
          LVar18 = LY_EVALID;
        }
LAB_001511dd:
        if (LVar18 != LY_SUCCESS) goto LAB_00151734;
        pcVar45 = *(char **)(pcVar45 + 8);
      } while (pcVar45 != (char *)0x0);
    }
    lVar33 = puVar8[4];
    if (lVar33 == 0) {
      LVar18 = LY_SUCCESS;
LAB_00151734:
      ctx->cur_mod = plVar11;
      ctx->pmod = plVar12;
      strcpy(pcVar25,local_1028);
      sVar40 = strlen(pcVar25);
      ctx->path_len = (uint32_t)sVar40;
      LVar17 = LVar18;
    }
    else {
      plVar46 = plVar10->exts;
      if (plVar46 == (lysp_ext_instance *)0x0) {
        plVar22 = (lysp_ext_instance *)0x0;
        plVar26 = (long *)calloc(1,*(long *)(lVar33 + -8) * 0x70 | 8);
      }
      else {
        plVar22 = plVar46[-1].exts;
        plVar26 = (long *)realloc(&plVar46[-1].exts,
                                  ((long)&(plVar46[-1].exts)->name + *(long *)(lVar33 + -8)) * 0x70
                                  | 8);
      }
      if (plVar26 == (long *)0x0) {
        bVar49 = false;
        LVar17 = LY_EMEM;
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_deviation");
      }
      else {
        plVar10->exts = (lysp_ext_instance *)(plVar26 + 1);
        if (puVar8[4] == 0) {
          sVar40 = 0;
        }
        else {
          sVar40 = *(long *)(puVar8[4] + -8) * 0x70;
        }
        memset(plVar26 + *plVar26 * 0xe + 1,0,sVar40);
        uVar48 = 0xffffffffffffffff;
        lVar33 = 0;
        do {
          if (puVar8[4] == 0) {
            uVar23 = 0;
          }
          else {
            uVar23 = *(ulong *)(puVar8[4] + -8);
          }
          uVar48 = uVar48 + 1;
          bVar49 = uVar23 <= uVar48;
          LVar17 = LY_EMEM;
          if (bVar49) goto LAB_00151725;
          pplVar1 = &plVar10->exts[-1].exts;
          *pplVar1 = (lysp_ext_instance *)((long)&(*pplVar1)->name + 1);
          plVar42 = ctx->ctx;
          lVar19 = lyplg_ext_nodetype2stmt(plVar10->nodetype);
          LVar17 = lysp_ext_dup(plVar42,plVar9,plVar10,lVar19,
                                (lysp_ext_instance *)(puVar8[4] + lVar33),
                                (lysp_ext_instance *)
                                ((long)&plVar10->exts[(long)plVar22].name + lVar33));
          lVar33 = lVar33 + 0x70;
        } while (LVar17 == LY_SUCCESS);
        bVar49 = false;
      }
LAB_00151725:
      LVar18 = LY_SUCCESS;
      if (bVar49) goto LAB_00151734;
    }
    pvVar27 = (void *)((long)pvVar27 + 1);
  } while (LVar17 == LY_SUCCESS);
LAB_001517a2:
  if (LVar17 != LY_SUCCESS) {
    lysp_dev_node_free(ctx,*dev_pnode);
    *dev_pnode = (lysp_node *)0x0;
    *not_supported = '\0';
  }
  return LVar17;
}

Assistant:

LY_ERR
lys_compile_node_deviations_refines(struct lysc_ctx *ctx, const struct lysp_node *pnode, const struct lysc_node *parent,
        struct lysp_node **dev_pnode, ly_bool *not_supported)
{
    LY_ERR ret = LY_SUCCESS;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_refine *rfn;
    struct lysc_deviation *dev;

    *dev_pnode = NULL;
    *not_supported = 0;

    for (i = 0; i < ctx->uses_rfns.count; ) {
        rfn = ctx->uses_rfns.objs[i];

        if (!lysp_schema_nodeid_match(rfn->nodeid, rfn->nodeid_pmod, NULL, rfn->nodeid_ctx_node, parent, pnode,
                ctx->cur_mod, ctx->ext)) {
            /* not our target node */
            ++i;
            continue;
        }

        if (!*dev_pnode) {
            /* first refine on this node, create a copy first */
            LY_CHECK_GOTO(ret = lysp_dup_single(ctx, pnode, 1, dev_pnode), cleanup);
        }

        /* apply all the refines by changing (the copy of) the parsed node */
        LY_ARRAY_FOR(rfn->rfns, u) {
            LY_CHECK_GOTO(ret = lys_apply_refine(ctx, rfn->rfns[u], rfn->nodeid_pmod, *dev_pnode), cleanup);
        }

        /* refine was applied, remove it */
        lysc_refine_free(ctx->ctx, rfn);
        ly_set_rm_index(&ctx->uses_rfns, i, NULL);

        /* refines use relative paths so more may apply to a single node */
    }

    for (i = 0; i < ctx->devs.count; ++i) {
        dev = ctx->devs.objs[i];

        if (!lysp_schema_nodeid_match(dev->nodeid, dev->dev_pmods[0], NULL, NULL, parent, pnode, ctx->cur_mod, ctx->ext)) {
            /* not our target node */
            continue;
        }

        if (dev->not_supported) {
            /* it is not supported, no more deviations */
            *not_supported = 1;
            goto dev_applied;
        }

        if (!*dev_pnode) {
            /* first deviation on this node, create a copy first */
            LY_CHECK_GOTO(ret = lysp_dup_single(ctx, pnode, 1, dev_pnode), cleanup);
        }

        /* apply all the deviates by changing (the copy of) the parsed node */
        LY_ARRAY_FOR(dev->devs, u) {
            LY_CHECK_GOTO(ret = lys_apply_deviation(ctx, dev->devs[u], dev->dev_pmods[u], *dev_pnode), cleanup);
        }

dev_applied:
        /* deviation was applied, remove it */
        lysc_deviation_free(ctx->ctx, dev);
        ly_set_rm_index(&ctx->devs, i, NULL);

        /* all the deviations for one target node are in one structure, we are done */
        break;
    }

cleanup:
    if (ret) {
        lysp_dev_node_free(ctx, *dev_pnode);
        *dev_pnode = NULL;
        *not_supported = 0;
    }
    return ret;
}